

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4bb92::der_operators_log_e_Test::TestBody(der_operators_log_e_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  double dVar4;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  float local_44;
  double local_40;
  double local_38;
  
  testing::internal::CmpHelperFloatingPointEQ<float>(local_58,"f::f(1.0f)","0.0f",0.0,0.0);
  iVar1 = local_58[0];
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    testing::internal::CmpHelperFloatingPointEQ<float>(local_58,"f::d(1.0f)","1.0f",1.0,1.0);
    iVar1 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      testing::internal::CmpHelperFloatingPointEQ<float>(local_58,"f::d(10.0f)","0.1f",0.1,0.1);
      iVar1 = local_58[0];
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                   ,0x60,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar1 != (internal)0x0) {
        testing::internal::CmpHelperFloatingPointEQ<float>(local_58,"g::d(10.0f)","0.1f",0.1,0.1);
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          if (local_50.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                     ,0x61,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_68.ptr_ + 8))();
            }
            local_68.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40 = 0.1;
        do {
          dVar4 = log(local_40);
          local_44 = (float)dVar4;
          dVar4 = log(local_40);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_58,"f::f(x)","g::f(x)",local_44,(float)(dVar4 * 1.000000030367861));
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            pcVar3 = "";
            if (local_50.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,100,pcVar3);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_68.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_68.ptr_ + 8))();
              }
              local_68.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_38 = 1.0 / local_40;
          local_44 = (float)local_38;
          dVar4 = log(local_40);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_58,"f::d(x)","g::d(x)",local_44,
                     (float)(dVar4 * -0.0 + local_38 * 1.000000030367861));
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            pcVar3 = "";
            if (local_50.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,0x65,pcVar3);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_68.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_68.ptr_ + 8))();
              }
              local_68.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_40 = local_40 + 0.1;
        } while (local_40 < 10.0);
      }
    }
  }
  return;
}

Assistant:

TEST(der_operators, log_e)
    {
        // y = lnx
        // dy/dx = 1/x
        typedef op_ln<variant> f;
        typedef op_div<op_ln<variant>, op_ln<constant<E>>> g;
        ASSERT_FLOAT_EQ(f::f(1.0f), 0.0f);
        ASSERT_FLOAT_EQ(f::d(1.0f), 1.0f);
        ASSERT_FLOAT_EQ(f::d(10.0f), 0.1f);
        EXPECT_FLOAT_EQ(g::d(10.0f), 0.1f);
        for (double x = 0.1; x < 10.0; x += 0.1)
        {
            EXPECT_FLOAT_EQ(f::f(x), g::f(x));
            EXPECT_FLOAT_EQ(f::d(x), g::d(x));
        }
    }